

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall ArgTest_StringArg_Test::~ArgTest_StringArg_Test(ArgTest_StringArg_Test *this)

{
  void *in_RDI;
  
  ~ArgTest_StringArg_Test((ArgTest_StringArg_Test *)0x12c588);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(ArgTest, StringArg) {
  char str_data[] = "test";
  char *str = str_data;
  const char *cstr = str;
  CHECK_ARG_(char, cstr, str);

  string_view sref(str);
  CHECK_ARG_(char, sref, std::string(str));
}